

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void Unserialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
               (DataStream *is,vector<unsigned_char,_std::allocator<unsigned_char>_> *v)

{
  long lVar1;
  pointer puVar2;
  uint64_t uVar3;
  size_t in_RCX;
  uint uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  uVar3 = ReadCompactSize<DataStream>(is,true);
  uVar5 = 0;
  while (uVar4 = (uint)uVar3 - uVar5, uVar5 <= (uint)uVar3 && uVar4 != 0) {
    if (4999999 < uVar4) {
      uVar4 = 5000000;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(v,(ulong)(uVar4 + uVar5));
    DataStream::read(is,uVar5 + (int)(v->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data._M_start,(void *)(ulong)uVar4
                     ,in_RCX);
    uVar5 = uVar4 + uVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& is, std::vector<T, A>& v)
{
    if constexpr (BasicByte<T>) { // Use optimized version for unformatted basic bytes
        // Limit size per read so bogus size value won't cause out of memory
        v.clear();
        unsigned int nSize = ReadCompactSize(is);
        unsigned int i = 0;
        while (i < nSize) {
            unsigned int blk = std::min(nSize - i, (unsigned int)(1 + 4999999 / sizeof(T)));
            v.resize(i + blk);
            is.read(AsWritableBytes(Span{&v[i], blk}));
            i += blk;
        }
    } else {
        Unserialize(is, Using<VectorFormatter<DefaultFormatter>>(v));
    }
}